

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpdata.cpp
# Opt level: O2

void __thiscall Httpdata::Add_New_Connect(Httpdata *this,int fd)

{
  Epoll *this_00;
  Httpdata *this_01;
  SP_channel conn_socket;
  __shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_01 = (Httpdata *)operator_new(0x90);
  Httpdata(this_01,fd,0x80000001,readn,writen,(this->super_channel).time_round);
  std::__shared_ptr<channel,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Httpdata,void>
            ((__shared_ptr<channel,(__gnu_cxx::_Lock_policy)2> *)&local_30,this_01);
  this_00 = (this->super_channel).attach_epoll;
  std::__shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,&local_30);
  Epoll::Epoll_Add(this_00,(SP_channel *)&local_40,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void Httpdata::Add_New_Connect(int fd)
{
    //channel* conn_socket = new Httpdata(fd,EPOLLIN | EPOLLET,readn,writen,true);
    SP_channel conn_socket(new Httpdata(fd,EPOLLIN | EPOLLET,readn,writen,time_round));
    attach_epoll->Epoll_Add(conn_socket,false);
}